

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

int router_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count,
                  int *out_stones)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  pthread_t pVar4;
  long lVar5;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  ev_state_data ev_state;
  cod_exec_context ec;
  _func_int_cod_exec_context_void_ptr_attr_list *func;
  int ret;
  response_instance_conflict instance;
  event_item *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  FILE *pFVar6;
  CManager_conflict in_stack_ffffffffffffff00;
  undefined4 local_d8;
  CMTraceType in_stack_ffffffffffffff2c;
  CManager in_stack_ffffffffffffff30;
  timespec local_c8;
  timespec local_b8;
  timespec local_a8;
  undefined1 local_98 [72];
  undefined8 local_50;
  code *local_48;
  uint local_3c;
  long local_30;
  int local_24;
  undefined8 local_20;
  long local_10;
  long local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_30 = in_R9;
  local_24 = in_R8D;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x10) == 0) {
    local_48 = (code *)**(undefined8 **)(in_RDX + 0x18);
    local_50 = *(undefined8 *)(in_RDX + 0x20);
    local_20 = in_RCX;
    local_10 = in_RSI;
    cod_assoc_client_data(local_50,0x34567890,local_98);
    local_3c = (*local_48)(local_50,*(undefined8 *)(local_10 + 0x20),local_20);
  }
  else {
    local_3c = (**(code **)(in_RDX + 0x10))(*(undefined8 *)(in_RSI + 0x20),in_RCX);
  }
  if ((int)local_3c < 0) {
    iVar1 = CMtrace_val[10];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = *(FILE **)(local_8 + 0x120);
        _Var2 = getpid();
        lVar5 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",lVar5,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_d8);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",
                CONCAT44(in_stack_ffffffffffffff2c,local_d8),in_stack_ffffffffffffff30);
      }
      fprintf(*(FILE **)(local_8 + 0x120),"Router function returned %d, NOT submitting\n",
              (ulong)local_3c);
    }
    fflush(*(FILE **)(local_8 + 0x120));
  }
  else if ((int)local_3c < local_24) {
    if (*(int *)(local_30 + (long)(int)local_3c * 4) == -1) {
      iVar1 = CMtrace_val[10];
      if (*(long *)(local_8 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = *(FILE **)(local_8 + 0x120);
          _Var2 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_b8);
          fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_b8.tv_sec,local_b8.tv_nsec);
        }
        fprintf(*(FILE **)(local_8 + 0x120),
                "Router function returned %d, which has not been set with EVaction_set_output()\n",
                (ulong)local_3c);
      }
      fflush(*(FILE **)(local_8 + 0x120));
    }
    else {
      iVar3 = CMtrace_val[10];
      if (*(long *)(local_8 + 0x120) == 0) {
        iVar3 = CMtrace_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar6 = *(FILE **)(local_8 + 0x120);
          _Var2 = getpid();
          in_stack_ffffffffffffff00 = (CManager_conflict)(long)_Var2;
          pVar4 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",in_stack_ffffffffffffff00,pVar4);
          iVar1 = (int)((ulong)pFVar6 >> 0x20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_c8);
          fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_c8.tv_sec,local_c8.tv_nsec);
        }
        fprintf(*(FILE **)(local_8 + 0x120),
                "Router function returned %d, submitting further to stone %d\n",(ulong)local_3c,
                (ulong)*(uint *)(local_30 + (long)(int)local_3c * 4));
      }
      fflush(*(FILE **)(local_8 + 0x120));
      internal_path_submit(in_stack_ffffffffffffff00,iVar1,in_stack_fffffffffffffef0);
    }
  }
  else {
    iVar1 = CMtrace_val[10];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = *(FILE **)(local_8 + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_a8);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_a8.tv_sec,local_a8.tv_nsec);
      }
      fprintf(*(FILE **)(local_8 + 0x120),
              "Router function returned %d, larger than the number of associated outputs\n",
              (ulong)local_3c);
    }
    fflush(*(FILE **)(local_8 + 0x120));
  }
  return local_3c;
}

Assistant:

static int
router_wrapper(CManager cm, struct _event_item *event, void *client_data,
	       attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    if (instance->u.filter.func_ptr) {
	ret = ((int(*)(void *, attr_list))instance->u.filter.func_ptr)(event->decoded_event, attrs);
    } else {
#ifdef HAVE_COD_H
	int (*func)(cod_exec_context, void *, attr_list) =
	    (int(*)(cod_exec_context, void *, attr_list))instance->u.filter.code->func;
	cod_exec_context ec = instance->u.filter.ec;
	struct ev_state_data ev_state;

	ev_state.cm = cm;
	ev_state.cur_event = event;
	ev_state.out_count = out_count;
	ev_state.out_stones = out_stones;
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);
	ret = (func)(ec, event->decoded_event, attrs);
#endif
    }
    if (ret >= 0) {
	if (ret >= out_count) {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, larger than the number of associated outputs\n", ret);
	} else if (out_stones[ret] == -1) {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, which has not been set with EVaction_set_output()\n", ret);
	} else {
	    CMtrace_out(cm, EVerbose, "Router function returned %d, submitting further to stone %d\n", ret, out_stones[ret]);
	    internal_path_submit(cm, out_stones[ret], event);
	}
    } else {
	CMtrace_out(cm, EVerbose, "Router function returned %d, NOT submitting\n", ret);
    }
    return ret;
}